

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueType.cpp
# Opt level: O3

ValueType __thiscall ValueType::ToDefiniteAnyNumber(ValueType *this)

{
  Bits BVar1;
  anon_union_2_4_ea848c7b_for_ValueType_13 valueType;
  Bits bits;
  anon_union_2_4_ea848c7b_for_ValueType_13 *this_00;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_14;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_12;
  
  BVar1 = (this->field_0).bits;
  if ((BVar1 & (PrimitiveOrObject|Object)) == 0) {
    bits = BVar1 & (Number|Float|IntIsLikelyUntagged|IntCanBeUntagged|Int|CanBeTaggedValue) |
           (Number|CanBeTaggedValue);
    if ((BVar1 & (Number|Float)) != 0) {
      bits = BVar1 & (Number|Float|IntIsLikelyUntagged|IntCanBeUntagged|Int|CanBeTaggedValue);
    }
    this_00 = &local_14;
  }
  else {
    this_00 = &local_12;
    bits = Number|CanBeTaggedValue;
  }
  ValueType((ValueType *)&this_00->field_0,bits);
  valueType.field_0 = this_00->field_0;
  Verify((ValueType)valueType.field_0);
  return (anon_union_2_4_ea848c7b_for_ValueType_13)
         (anon_union_2_4_ea848c7b_for_ValueType_13)valueType.field_0;
}

Assistant:

ValueType ValueType::ToDefiniteAnyNumber() const
{
    // Not asserting on expected value type because Conv_Num allows converting values of arbitrary types to number
    if(OneOn(Bits::Object | Bits::PrimitiveOrObject))
        return Verify(Bits::Number | Bits::CanBeTaggedValue);
    Bits numberBits =
        bits &
        (
            Bits::Int |
            Bits::IntCanBeUntagged |
            Bits::IntIsLikelyUntagged |
            Bits::CanBeTaggedValue |
            Bits::Float |
            Bits::Number
        );
    if(!(numberBits & (Bits::Float | Bits::Number)))
        numberBits |= Bits::Number | Bits::CanBeTaggedValue;
    return Verify(numberBits);
}